

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O1

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined2 local_27;
  char local_25 [2];
  char local_23 [3];
  char *local_20;
  
  if (n < 1000) {
    uVar4 = n % 100;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)((ulong)n / 100) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar4 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
  }
  else {
    local_20 = local_25;
    uVar5 = (ulong)n;
    do {
      pcVar3 = local_20;
      uVar4 = (uint)uVar5;
      uVar6 = uVar5 / 100;
      uVar2 = uVar5 / 100;
      *(undefined2 *)pcVar3 =
           *(undefined2 *)
            (&::fmt::v7::detail::basic_data<void>::digits + (ulong)(uVar4 + (int)uVar2 * -100) * 2);
      local_20 = pcVar3 + -2;
      uVar5 = uVar6;
    } while (9999 < uVar4);
    if (uVar4 < 1000) {
      pcVar3[-1] = (byte)uVar6 | 0x30;
      local_20 = pcVar3 + -1;
    }
    else {
      *(undefined2 *)local_20 =
           *(undefined2 *)(&::fmt::v7::detail::basic_data<void>::digits + uVar2 * 2);
    }
    ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000)
    {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    }
    else
    {
        append_int(n, dest);
    }
}